

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O3

void Abc_FlowRetime_ConstrainExact(Abc_Obj_t *pObj)

{
  Flow_Data_t *pFVar1;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  bool bVar5;
  void **ppvVar6;
  long lVar7;
  int iVar8;
  long *plVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  
  if ((undefined1  [24])
      ((undefined1  [24])pManMR->pDataArray[(uint)pObj->Id] & (undefined1  [24])0x80) !=
      (undefined1  [24])0x0) {
    pFVar1 = pManMR->pDataArray + (uint)pObj->Id;
    pManMR->nConservConstraints = pManMR->nConservConstraints + -1;
    *(byte *)pFVar1 = *(byte *)pFVar1 & 0x7f;
  }
  vNodes = pManMR->vNodes;
  if (pManMR->fIsForward == 0) {
    if (vNodes->nSize != 0) {
      __assert_fail("!Vec_PtrSize( vNodes )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                    ,0x215,"void Abc_FlowRetime_ConstrainExact_back(Abc_Obj_t *)");
    }
    if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
      __assert_fail("!Abc_ObjIsLatch(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                    ,0x216,"void Abc_FlowRetime_ConstrainExact_back(Abc_Obj_t *)");
    }
    if (pManMR->vTimeEdges[(uint)pObj->Id].nSize != 0) {
      __assert_fail("!Vec_PtrSize( FTIMEEDGES(pObj) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                    ,0x217,"void Abc_FlowRetime_ConstrainExact_back(Abc_Obj_t *)");
    }
    pVVar2 = pManMR->vExactNodes;
    uVar10 = pVVar2->nSize;
    if (uVar10 == pVVar2->nCap) {
      if ((int)uVar10 < 0x10) {
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
        }
        pVVar2->pArray = ppvVar6;
        pVVar2->nCap = 0x10;
      }
      else {
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar10 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar10 << 4);
        }
        pVVar2->pArray = ppvVar6;
        pVVar2->nCap = uVar10 * 2;
      }
    }
    else {
      ppvVar6 = pVVar2->pArray;
    }
    iVar8 = pVVar2->nSize;
    pVVar2->nSize = iVar8 + 1;
    ppvVar6[iVar8] = pObj;
    Abc_FlowRetime_ConstrainExact_back_rec(pObj,vNodes,0);
    lVar7 = (long)vNodes->nSize;
    if (0 < (long)vNodes->nSize) {
      do {
        if (vNodes->nSize < lVar7) goto LAB_004de920;
        plVar9 = (long *)((ulong)vNodes->pArray[lVar7 + -1] & 0xfffffffffffffffe);
        if ((long *)vNodes->pArray[lVar7 + -1] == plVar9) {
          uVar10 = *(uint *)((long)plVar9 + 0x14);
          if ((uVar10 & 0xf) == 8) {
            __assert_fail("!Abc_ObjIsLatch(pReg)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                          ,0x221,"void Abc_FlowRetime_ConstrainExact_back(Abc_Obj_t *)");
          }
          if (0 < *(int *)((long)plVar9 + 0x2c)) {
            lVar11 = 0;
            do {
              lVar3 = *(long *)(*(long *)(*(long *)(*plVar9 + 0x20) + 8) +
                               (long)*(int *)(plVar9[6] + lVar11 * 4) * 8);
              uVar10 = *(uint *)(lVar3 + 0x14);
              uVar12 = uVar10 >> 0xc;
              uVar13 = (uint)((*(uint *)((long)plVar9 + 0x14) & 0xf) == 7) +
                       (*(uint *)((long)plVar9 + 0x14) >> 0xc);
              if (uVar12 <= uVar13) {
                uVar12 = uVar13;
              }
              *(uint *)(lVar3 + 0x14) = uVar10 & 0xfff | uVar12 << 0xc;
              lVar11 = lVar11 + 1;
            } while (lVar11 < *(int *)((long)plVar9 + 0x2c));
            uVar10 = *(uint *)((long)plVar9 + 0x14);
          }
          if (pManMR->maxDelay < (int)(uVar10 >> 0xc)) {
            __assert_fail("(int)pReg->Level <= pManMR->maxDelay",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                          ,0x224,"void Abc_FlowRetime_ConstrainExact_back(Abc_Obj_t *)");
          }
          *(uint *)((long)plVar9 + 0x14) = uVar10 & 0xfcf;
        }
        bVar5 = 1 < lVar7;
        lVar7 = lVar7 + -1;
      } while (bVar5);
      lVar7 = (long)vNodes->nSize;
      if (0 < (long)vNodes->nSize) {
        do {
          if (vNodes->nSize < lVar7) goto LAB_004de920;
          plVar9 = (long *)((ulong)vNodes->pArray[lVar7 + -1] & 0xfffffffffffffffe);
          if ((long *)vNodes->pArray[lVar7 + -1] != plVar9) {
            iVar8 = *(int *)((long)plVar9 + 0x2c);
            if (0 < iVar8) {
              lVar11 = 0;
              do {
                lVar3 = *(long *)(*(long *)(*(long *)(*plVar9 + 0x20) + 8) +
                                 (long)*(int *)(plVar9[6] + lVar11 * 4) * 8);
                uVar10 = *(uint *)(lVar3 + 0x14);
                if ((uVar10 & 0xf) != 8) {
                  uVar13 = (uint)((*(uint *)((long)plVar9 + 0x14) & 0xf) == 7) +
                           (*(uint *)((long)plVar9 + 0x14) >> 0xc);
                  uVar12 = uVar10 >> 0xc;
                  if (uVar10 >> 0xc <= uVar13) {
                    uVar12 = uVar13;
                  }
                  *(uint *)(lVar3 + 0x14) = uVar10 & 0xfff | uVar12 << 0xc;
                  iVar8 = *(int *)((long)plVar9 + 0x2c);
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 < iVar8);
            }
            uVar10 = *(uint *)((long)plVar9 + 0x14);
            if (uVar10 >> 0xc == pManMR->maxDelay) {
              pVVar4 = pManMR->vTimeEdges;
              uVar10 = pObj->Id;
              pVVar2 = pVVar4 + uVar10;
              uVar12 = pVVar4[uVar10].nSize;
              if (uVar12 == pVVar4[uVar10].nCap) {
                if ((int)uVar12 < 0x10) {
                  if (pVVar2->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
                  }
                  pVVar2->pArray = ppvVar6;
                  pVVar2->nCap = 0x10;
                }
                else {
                  if (pVVar2->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc((ulong)uVar12 << 4);
                  }
                  else {
                    ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar12 << 4);
                  }
                  pVVar2->pArray = ppvVar6;
                  pVVar2->nCap = uVar12 * 2;
                }
              }
              else {
                ppvVar6 = pVVar2->pArray;
              }
              iVar8 = pVVar2->nSize;
              pVVar2->nSize = iVar8 + 1;
              ppvVar6[iVar8] = plVar9;
              pManMR->nExactConstraints = pManMR->nExactConstraints + 1;
              uVar10 = *(uint *)((long)plVar9 + 0x14);
            }
            *(uint *)((long)plVar9 + 0x14) = uVar10 & 0xfcf;
          }
          bVar5 = 1 < lVar7;
          lVar7 = lVar7 + -1;
        } while (bVar5);
      }
    }
  }
  else {
    if (vNodes->nSize != 0) {
      __assert_fail("!Vec_PtrSize(vNodes)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                    ,0x1ca,"void Abc_FlowRetime_ConstrainExact_forw(Abc_Obj_t *)");
    }
    if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
      __assert_fail("!Abc_ObjIsLatch(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                    ,0x1cb,"void Abc_FlowRetime_ConstrainExact_forw(Abc_Obj_t *)");
    }
    if (pManMR->vTimeEdges[(uint)pObj->Id].nSize != 0) {
      __assert_fail("!Vec_PtrSize( FTIMEEDGES(pObj) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                    ,0x1cc,"void Abc_FlowRetime_ConstrainExact_forw(Abc_Obj_t *)");
    }
    pVVar2 = pManMR->vExactNodes;
    uVar10 = pVVar2->nSize;
    if (uVar10 == pVVar2->nCap) {
      if ((int)uVar10 < 0x10) {
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
        }
        pVVar2->pArray = ppvVar6;
        pVVar2->nCap = 0x10;
      }
      else {
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar10 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar10 << 4);
        }
        pVVar2->pArray = ppvVar6;
        pVVar2->nCap = uVar10 * 2;
      }
    }
    else {
      ppvVar6 = pVVar2->pArray;
    }
    iVar8 = pVVar2->nSize;
    pVVar2->nSize = iVar8 + 1;
    ppvVar6[iVar8] = pObj;
    Abc_FlowRetime_ConstrainExact_forw_rec(pObj,vNodes,0);
    lVar7 = (long)vNodes->nSize;
    if (0 < (long)vNodes->nSize) {
      do {
        if (vNodes->nSize < lVar7) goto LAB_004de920;
        plVar9 = (long *)((ulong)vNodes->pArray[lVar7 + -1] & 0xfffffffffffffffe);
        if ((long *)vNodes->pArray[lVar7 + -1] == plVar9) {
          uVar10 = *(uint *)((long)plVar9 + 0x14);
          if ((uVar10 & 0xf) == 8) {
            __assert_fail("!Abc_ObjIsLatch(pReg)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                          ,0x1d6,"void Abc_FlowRetime_ConstrainExact_forw(Abc_Obj_t *)");
          }
          if (0 < *(int *)((long)plVar9 + 0x1c)) {
            lVar11 = 0;
            do {
              lVar3 = *(long *)(*(long *)(*(long *)(*plVar9 + 0x20) + 8) +
                               (long)*(int *)(plVar9[4] + lVar11 * 4) * 8);
              uVar10 = *(uint *)(lVar3 + 0x14);
              uVar12 = uVar10 >> 0xc;
              uVar13 = (uint)((*(uint *)((long)plVar9 + 0x14) & 0xf) == 7) +
                       (*(uint *)((long)plVar9 + 0x14) >> 0xc);
              if (uVar12 <= uVar13) {
                uVar12 = uVar13;
              }
              *(uint *)(lVar3 + 0x14) = uVar10 & 0xfff | uVar12 << 0xc;
              lVar11 = lVar11 + 1;
            } while (lVar11 < *(int *)((long)plVar9 + 0x1c));
            uVar10 = *(uint *)((long)plVar9 + 0x14);
          }
          if (pManMR->maxDelay < (int)(uVar10 >> 0xc)) {
            __assert_fail("(int)pReg->Level <= pManMR->maxDelay",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                          ,0x1d9,"void Abc_FlowRetime_ConstrainExact_forw(Abc_Obj_t *)");
          }
          *(uint *)((long)plVar9 + 0x14) = uVar10 & 0xfcf;
        }
        bVar5 = 1 < lVar7;
        lVar7 = lVar7 + -1;
      } while (bVar5);
      lVar7 = (long)vNodes->nSize;
      if (0 < (long)vNodes->nSize) {
        do {
          if (vNodes->nSize < lVar7) {
LAB_004de920:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          plVar9 = (long *)((ulong)vNodes->pArray[lVar7 + -1] & 0xfffffffffffffffe);
          if ((long *)vNodes->pArray[lVar7 + -1] != plVar9) {
            iVar8 = *(int *)((long)plVar9 + 0x1c);
            if (0 < iVar8) {
              lVar11 = 0;
              do {
                lVar3 = *(long *)(*(long *)(*(long *)(*plVar9 + 0x20) + 8) +
                                 (long)*(int *)(plVar9[4] + lVar11 * 4) * 8);
                uVar10 = *(uint *)(lVar3 + 0x14);
                if ((uVar10 & 0xf) != 8) {
                  uVar13 = (uint)((*(uint *)((long)plVar9 + 0x14) & 0xf) == 7) +
                           (*(uint *)((long)plVar9 + 0x14) >> 0xc);
                  uVar12 = uVar10 >> 0xc;
                  if (uVar10 >> 0xc <= uVar13) {
                    uVar12 = uVar13;
                  }
                  *(uint *)(lVar3 + 0x14) = uVar10 & 0xfff | uVar12 << 0xc;
                  iVar8 = *(int *)((long)plVar9 + 0x1c);
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 < iVar8);
            }
            uVar10 = *(uint *)((long)plVar9 + 0x14);
            if (uVar10 >> 0xc == pManMR->maxDelay) {
              pVVar4 = pManMR->vTimeEdges;
              uVar10 = pObj->Id;
              pVVar2 = pVVar4 + uVar10;
              uVar12 = pVVar4[uVar10].nSize;
              if (uVar12 == pVVar4[uVar10].nCap) {
                if ((int)uVar12 < 0x10) {
                  if (pVVar2->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
                  }
                  pVVar2->pArray = ppvVar6;
                  pVVar2->nCap = 0x10;
                }
                else {
                  if (pVVar2->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc((ulong)uVar12 << 4);
                  }
                  else {
                    ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar12 << 4);
                  }
                  pVVar2->pArray = ppvVar6;
                  pVVar2->nCap = uVar12 * 2;
                }
              }
              else {
                ppvVar6 = pVVar2->pArray;
              }
              iVar8 = pVVar2->nSize;
              pVVar2->nSize = iVar8 + 1;
              ppvVar6[iVar8] = plVar9;
              pManMR->nExactConstraints = pManMR->nExactConstraints + 1;
              uVar10 = *(uint *)((long)plVar9 + 0x14);
            }
            *(uint *)((long)plVar9 + 0x14) = uVar10 & 0xfcf;
          }
          bVar5 = 1 < lVar7;
          lVar7 = lVar7 + -1;
        } while (bVar5);
      }
    }
  }
  vNodes->nSize = 0;
  return;
}

Assistant:

void Abc_FlowRetime_ConstrainExact( Abc_Obj_t * pObj ) {

  if (FTEST( pObj, CONSERVATIVE )) {
    pManMR->nConservConstraints--;
    FUNSET( pObj, CONSERVATIVE );
  }

#if !defined(IGNORE_TIMING)
  if (pManMR->fIsForward) {
    Abc_FlowRetime_ConstrainExact_forw(pObj);
  } else {
    Abc_FlowRetime_ConstrainExact_back(pObj);
  }
#endif
}